

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtMinBase(word *pTruth,int *pVars,int nVars,int nVarsAll)

{
  int iVar1;
  int local_30;
  int local_2c;
  int k;
  int i;
  int nVarsAll_local;
  int nVars_local;
  int *pVars_local;
  word *pTruth_local;
  
  if (nVarsAll < nVars) {
    __assert_fail("nVars <= nVarsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  local_30 = 0;
  for (local_2c = 0; local_2c < nVars; local_2c = local_2c + 1) {
    iVar1 = Abc_TtHasVar(pTruth,nVarsAll,local_2c);
    if (iVar1 != 0) {
      if (local_30 < local_2c) {
        if (pVars != (int *)0x0) {
          pVars[local_30] = pVars[local_2c];
        }
        Abc_TtSwapVars(pTruth,nVarsAll,local_30,local_2c);
      }
      local_30 = local_30 + 1;
    }
  }
  if ((local_30 != nVars) && (nVars <= local_30)) {
    __assert_fail("k < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  return local_30;
}

Assistant:

static inline int Abc_TtMinBase( word * pTruth, int * pVars, int nVars, int nVarsAll ) 
{
    int i, k;
    assert( nVars <= nVarsAll );
    for ( i = k = 0; i < nVars; i++ )
    {
        if ( !Abc_TtHasVar( pTruth, nVarsAll, i ) )
            continue;
        if ( k < i )
        {
            if ( pVars ) pVars[k] = pVars[i];
            Abc_TtSwapVars( pTruth, nVarsAll, k, i );
        }
        k++;
    }
    if ( k == nVars )
        return k;
    assert( k < nVars );
//    assert( k == Abc_TtSupportSize(pTruth, nVars) );
    return k;
}